

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

int __thiscall OpenMD::DataStorage::copy(DataStorage *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  uint extraout_EAX;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  int in_stack_00000034;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_00000038;
  DataStorage *in_stack_00000040;
  
  if ((this->storageLayout_ & 1U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 2U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 4U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 8U) != 0) {
    internalCopy<OpenMD::SquareMatrix3<double>>
              (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x10U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x20U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x40U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x80U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x100U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x200U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x400U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x800U) != 0) {
    internalCopy<OpenMD::SquareMatrix3<double>>
              (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x1000U) != 0) {
    internalCopy<OpenMD::Vector3<double>>
              (in_stack_00000040,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x2000U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x4000U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x8000U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  if ((this->storageLayout_ & 0x10000U) != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
  }
  uVar1 = this->storageLayout_ & 0x20000;
  if (uVar1 != 0) {
    internalCopy<double>
              (in_stack_00000040,(vector<double,_std::allocator<double>_> *)in_stack_00000038,
               in_stack_00000034,in_stack_00000028,in_stack_00000020);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void DataStorage::copy(int source, std::size_t num, std::size_t target) {
    if (num + target > size_) {
      // error
    }

    if (storageLayout_ & dslPosition) {
      internalCopy(position, source, num, target);
    }

    if (storageLayout_ & dslVelocity) {
      internalCopy(velocity, source, num, target);
    }

    if (storageLayout_ & dslForce) { internalCopy(force, source, num, target); }

    if (storageLayout_ & dslAmat) { internalCopy(aMat, source, num, target); }

    if (storageLayout_ & dslAngularMomentum) {
      internalCopy(angularMomentum, source, num, target);
    }

    if (storageLayout_ & dslTorque) {
      internalCopy(torque, source, num, target);
    }

    if (storageLayout_ & dslParticlePot) {
      internalCopy(particlePot, source, num, target);
    }

    if (storageLayout_ & dslDensity) {
      internalCopy(density, source, num, target);
    }

    if (storageLayout_ & dslFunctional) {
      internalCopy(functional, source, num, target);
    }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalCopy(functionalDerivative, source, num, target);
    }

    if (storageLayout_ & dslDipole) {
      internalCopy(dipole, source, num, target);
    }

    if (storageLayout_ & dslQuadrupole) {
      internalCopy(quadrupole, source, num, target);
    }

    if (storageLayout_ & dslElectricField) {
      internalCopy(electricField, source, num, target);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalCopy(skippedCharge, source, num, target);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalCopy(flucQPos, source, num, target);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalCopy(flucQVel, source, num, target);
    }
    if (storageLayout_ & dslFlucQForce) {
      internalCopy(flucQFrc, source, num, target);
    }

    if (storageLayout_ & dslSitePotential) {
      internalCopy(sitePotential, source, num, target);
    }
  }